

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::StringStream<4096UL,_4096UL>::append
          (StringStream<4096UL,_4096UL> *this,char *s,size_t len)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  Buffer *pBVar4;
  char *__dest;
  CompilerError *this_00;
  size_t __size;
  ulong __n;
  
  sVar2 = (this->current_buffer).offset;
  sVar3 = (this->current_buffer).size;
  __n = sVar3 - sVar2;
  if (len < __n || len - __n == 0) {
    memcpy((this->current_buffer).buffer + sVar2,s,len);
    psVar1 = &(this->current_buffer).offset;
    *psVar1 = *psVar1 + len;
  }
  else {
    if (sVar3 != sVar2) {
      memcpy((this->current_buffer).buffer + sVar2,s,__n);
      s = s + __n;
      psVar1 = &(this->current_buffer).offset;
      *psVar1 = *psVar1 + __n;
      len = len - __n;
    }
    SmallVector<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL>::reserve
              (&this->saved_buffers,
               (this->saved_buffers).
               super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
               buffer_size + 1);
    pBVar4 = (this->saved_buffers).
             super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.ptr;
    sVar2 = (this->saved_buffers).
            super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.buffer_size
    ;
    pBVar4[sVar2].size = (this->current_buffer).size;
    sVar3 = (this->current_buffer).offset;
    pBVar4 = pBVar4 + sVar2;
    pBVar4->buffer = (this->current_buffer).buffer;
    pBVar4->offset = sVar3;
    psVar1 = &(this->saved_buffers).
              super_VectorView<diligent_spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
              buffer_size;
    *psVar1 = *psVar1 + 1;
    __size = 0x1000;
    if (0x1000 < len) {
      __size = len;
    }
    __dest = (char *)malloc(__size);
    (this->current_buffer).buffer = __dest;
    if (__dest == (char *)0x0) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Out of memory.");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    memcpy(__dest,s,len);
    (this->current_buffer).offset = len;
    (this->current_buffer).size = __size;
  }
  return;
}

Assistant:

void append(const char *s, size_t len)
	{
		size_t avail = current_buffer.size - current_buffer.offset;
		if (avail < len)
		{
			if (avail > 0)
			{
				memcpy(current_buffer.buffer + current_buffer.offset, s, avail);
				s += avail;
				len -= avail;
				current_buffer.offset += avail;
			}

			saved_buffers.push_back(current_buffer);
			size_t target_size = len > BlockSize ? len : BlockSize;
			current_buffer.buffer = static_cast<char *>(malloc(target_size));
			if (!current_buffer.buffer)
				SPIRV_CROSS_THROW("Out of memory.");

			memcpy(current_buffer.buffer, s, len);
			current_buffer.offset = len;
			current_buffer.size = target_size;
		}
		else
		{
			memcpy(current_buffer.buffer + current_buffer.offset, s, len);
			current_buffer.offset += len;
		}
	}